

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraSublimeTextGenerator.cxx
# Opt level: O1

void __thiscall
cmExtraSublimeTextGenerator::AppendTarget
          (cmExtraSublimeTextGenerator *this,cmGeneratedFileStream *fout,string *targetName,
          cmLocalGenerator *lg,cmGeneratorTarget *target,char *make,cmMakefile *makefile,
          char *param_7,MapSourceFileFlags *sourceFileFlags,bool firstTarget)

{
  pointer pbVar1;
  cmSourceFile *this_00;
  pointer pcVar2;
  cmLocalGenerator *lg_00;
  cmGeneratorTarget *target_00;
  bool bVar3;
  int iVar4;
  string *psVar5;
  pointer ppcVar6;
  RegularExpression *this_01;
  iterator iVar7;
  long *plVar8;
  undefined8 *puVar9;
  ostream *poVar10;
  long *plVar11;
  size_type *psVar12;
  char *pcVar13;
  _Base_ptr this_02;
  undefined8 uVar14;
  undefined8 uVar15;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_bool>
  pVar16;
  string workString;
  string definesString;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> sourceFiles;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string includesString;
  string makefileName;
  undefined1 local_248 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_228;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_218;
  long *local_208;
  ulong local_200;
  long local_1f8;
  undefined8 uStack_1f0;
  string local_1e8;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> local_1c8;
  cmLocalGenerator *local_1a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1a0 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_190;
  long *local_180;
  long local_178;
  long local_170;
  long lStack_168;
  string local_160;
  cmExtraSublimeTextGenerator *local_140;
  string *local_138;
  cmGeneratedFileStream *local_130;
  char *local_128;
  _Base_ptr local_120;
  pointer local_118;
  cmGeneratorTarget *local_110;
  pointer local_108;
  undefined1 local_100 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_e0 [2];
  char *local_b0;
  char *local_60;
  char *local_40;
  
  local_1a8 = lg;
  local_128 = make;
  if (target != (cmGeneratorTarget *)0x0) {
    local_1c8.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_1c8.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1c8.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_100._0_8_ = local_100 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_100,"CMAKE_BUILD_TYPE","");
    psVar5 = cmMakefile::GetSafeDefinition(makefile,(string *)local_100);
    cmGeneratorTarget::GetSourceFiles(target,&local_1c8,psVar5);
    local_140 = this;
    local_138 = targetName;
    local_130 = fout;
    local_110 = target;
    if ((undefined1 *)local_100._0_8_ != local_100 + 0x10) {
      operator_delete((void *)local_100._0_8_,CONCAT71(local_100._17_7_,local_100[0x10]) + 1);
    }
    lg_00 = local_1a8;
    local_118 = local_1c8.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    if (local_1c8.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_1c8.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      local_120 = &(sourceFileFlags->_M_t)._M_impl.super__Rb_tree_header._M_header;
      ppcVar6 = local_1c8.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
LAB_002d8711:
      this_00 = *ppcVar6;
      local_108 = ppcVar6;
      this_01 = (RegularExpression *)cmSourceFile::GetFullPath(this_00,(string *)0x0);
      iVar7 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
              ::find(&sourceFileFlags->_M_t,(key_type *)this_01);
      if (iVar7._M_node == local_120) {
        psVar5 = cmSourceFile::GetFullPath(this_00,(string *)0x0);
        local_248._0_8_ = (pointer)0x0;
        local_248._8_8_ = (pointer)0x0;
        local_248._16_8_ = (pointer)0x0;
        local_100._0_8_ = local_100 + 0x10;
        pcVar2 = (psVar5->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_100,pcVar2,pcVar2 + psVar5->_M_string_length);
        local_e0[0].
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)local_248._0_8_;
        local_e0[0].
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_248._8_8_;
        local_e0[0].
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_248._16_8_;
        local_248._0_8_ = (pointer)0x0;
        local_248._8_8_ = (pointer)0x0;
        local_248._16_8_ = (pointer)0x0;
        this_01 = (RegularExpression *)local_100;
        pVar16 = std::
                 _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
                 ::
                 _M_insert_unique<std::pair<std::__cxx11::string_const,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                           ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
                             *)sourceFileFlags,
                            (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)local_100);
        iVar7._M_node = (_Base_ptr)pVar16.first._M_node;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(local_e0);
        if ((undefined1 *)local_100._0_8_ != local_100 + 0x10) {
          this_01 = (RegularExpression *)(CONCAT71(local_100._17_7_,local_100[0x10]) + 1);
          operator_delete((void *)local_100._0_8_,(ulong)this_01);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_248);
      }
      target_00 = local_110;
      ComputeFlagsForObject_abi_cxx11_
                ((string *)local_248,(cmExtraSublimeTextGenerator *)this_01,this_00,lg_00,local_110)
      ;
      ComputeDefines_abi_cxx11_
                (&local_1e8,(cmExtraSublimeTextGenerator *)this_01,this_00,lg_00,target_00);
      ComputeIncludes_abi_cxx11_
                (&local_160,(cmExtraSublimeTextGenerator *)this_01,this_00,lg_00,target_00);
      this_02 = iVar7._M_node + 2;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_M_erase_at_end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)this_02,*(pointer *)this_02);
      local_100._0_8_ = (pointer)0x0;
      local_b0 = (char *)0x0;
      local_60 = (char *)0x0;
      local_40 = (char *)0x0;
      cmsys::RegularExpression::compile
                ((RegularExpression *)local_100,
                 "(^|[ ])-[DIOUWfgs][^= ]+(=\\\"[^\"]+\\\"|=[^\"][^ ]+)?");
      local_1a0[0] = &local_190;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_1a0,local_248._0_8_,
                 (char *)(local_248._0_8_ + (long)(_Alloc_hider *)local_248._8_8_));
      std::__cxx11::string::append((char *)local_1a0);
      plVar8 = (long *)std::__cxx11::string::_M_append
                                 ((char *)local_1a0,(ulong)local_1e8._M_dataplus._M_p);
      local_180 = &local_170;
      plVar11 = plVar8 + 2;
      if ((long *)*plVar8 == plVar11) {
        local_170 = *plVar11;
        lStack_168 = plVar8[3];
      }
      else {
        local_170 = *plVar11;
        local_180 = (long *)*plVar8;
      }
      local_178 = plVar8[1];
      *plVar8 = (long)plVar11;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      plVar8 = (long *)std::__cxx11::string::append((char *)&local_180);
      local_228._M_allocated_capacity = (size_type)&local_218;
      psVar12 = (size_type *)(plVar8 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar8 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar12) {
        local_218._M_allocated_capacity = *psVar12;
        local_218._8_8_ = plVar8[3];
      }
      else {
        local_218._M_allocated_capacity = *psVar12;
        local_228._M_allocated_capacity =
             (size_type)
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)*plVar8;
      }
      local_228._8_8_ = plVar8[1];
      *plVar8 = (long)psVar12;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      puVar9 = (undefined8 *)
               std::__cxx11::string::_M_append
                         (local_228._M_local_buf,(ulong)local_160._M_dataplus._M_p);
      local_208 = &local_1f8;
      plVar8 = puVar9 + 2;
      if ((long *)*puVar9 == plVar8) {
        local_1f8 = *plVar8;
        uStack_1f0 = puVar9[3];
      }
      else {
        local_1f8 = *plVar8;
        local_208 = (long *)*puVar9;
      }
      local_200 = puVar9[1];
      *puVar9 = plVar8;
      puVar9[1] = 0;
      *(undefined1 *)(puVar9 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_228._M_allocated_capacity != &local_218) {
        operator_delete((void *)local_228._M_allocated_capacity,local_218._M_allocated_capacity + 1)
        ;
      }
      if (local_180 != &local_170) {
        operator_delete(local_180,local_170 + 1);
      }
      uVar14 = local_190._M_allocated_capacity;
      uVar15 = local_1a0[0];
      if (local_1a0[0] == &local_190) goto LAB_002d8a4e;
      do {
        operator_delete((void *)uVar15,uVar14 + 1);
LAB_002d8a4e:
        do {
          while( true ) {
            bVar3 = cmsys::RegularExpression::find
                              ((RegularExpression *)local_100,(char *)local_208,
                               (RegularExpressionMatch *)local_100);
            if (!bVar3) {
              if (local_208 != &local_1f8) {
                operator_delete(local_208,local_1f8 + 1);
              }
              if (local_40 != (char *)0x0) {
                operator_delete__(local_40);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_160._M_dataplus._M_p != &local_160.field_2) {
                operator_delete(local_160._M_dataplus._M_p,
                                local_160.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
                operator_delete(local_1e8._M_dataplus._M_p,
                                local_1e8.field_2._M_allocated_capacity + 1);
              }
              if ((pointer)local_248._0_8_ != (pointer)(local_248 + 0x10)) {
                operator_delete((void *)local_248._0_8_,(ulong)(local_248._16_8_ + 1));
              }
              ppcVar6 = local_108 + 1;
              if (ppcVar6 != local_118) goto LAB_002d8711;
              goto LAB_002d8bcc;
            }
            std::__cxx11::string::substr((ulong)&local_228,(ulong)&local_208);
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_02,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_228);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_228._M_allocated_capacity != &local_218) {
              operator_delete((void *)local_228._M_allocated_capacity,
                              local_218._M_allocated_capacity + 1);
            }
            if ((ulong)((long)local_b0 - (long)local_60) < local_200) break;
            local_200 = 0;
            *(undefined1 *)local_208 = 0;
          }
          std::__cxx11::string::substr((ulong)&local_228,(ulong)&local_208);
          std::__cxx11::string::operator=((string *)&local_208,(string *)local_228._M_local_buf);
          uVar14 = local_218._M_allocated_capacity;
          uVar15 = local_228._M_allocated_capacity;
        } while ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_228._M_allocated_capacity == &local_218);
      } while( true );
    }
LAB_002d8bcc:
    this = local_140;
    fout = local_130;
    targetName = local_138;
    if (local_1c8.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1c8.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_1c8.
                            super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_1c8.
                            super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                            _M_impl.super__Vector_impl_data._M_start);
      this = local_140;
      fout = local_130;
      targetName = local_138;
    }
  }
  local_100._8_8_ = (char *)0x0;
  local_100[0x10] = '\0';
  local_100._0_8_ = local_100 + 0x10;
  (*((this->super_cmExternalMakefileProjectGenerator).GlobalGenerator)->_vptr_cmGlobalGenerator[3])
            (local_248);
  iVar4 = std::__cxx11::string::compare(local_248);
  pbVar1 = (pointer)(local_248 + 0x10);
  if ((pointer)local_248._0_8_ != pbVar1) {
    operator_delete((void *)local_248._0_8_,(ulong)(local_248._16_8_ + 1));
  }
  pcVar13 = "Makefile";
  if (iVar4 == 0) {
    pcVar13 = "build.ninja";
  }
  std::__cxx11::string::_M_replace((ulong)local_100,0,(char *)local_100._8_8_,(ulong)pcVar13);
  if (!firstTarget) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)fout,",\n\t",3);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)fout,"\t{\n\t\t\t\"name\": \"",0xf);
  cmLocalGenerator::GetProjectName_abi_cxx11_((string *)local_248,local_1a8);
  poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)fout,(char *)local_248._0_8_,local_248._8_8_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10," - ",3);
  poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                      (poVar10,(targetName->_M_dataplus)._M_p,targetName->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\",\n",3);
  if ((pointer)local_248._0_8_ != pbVar1) {
    operator_delete((void *)local_248._0_8_,(ulong)(local_248._16_8_ + 1));
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)fout,"\t\t\t\"cmd\": [",0xb);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1e8,local_128,(allocator<char> *)&local_160);
  BuildMakeCommand((string *)local_248,this,&local_1e8,(char *)local_100._0_8_,targetName);
  poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)fout,(char *)local_248._0_8_,local_248._8_8_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,"],\n",3);
  if ((pointer)local_248._0_8_ != pbVar1) {
    operator_delete((void *)local_248._0_8_,(ulong)(local_248._16_8_ + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)fout,"\t\t\t\"working_dir\": \"${project_path}\",\n",0x25);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)fout,
             "\t\t\t\"file_regex\": \"^(..[^:]*)(?::|\\\\()([0-9]+)(?::|\\\\))(?:([0-9]+):)?\\\\s*(.*)\"\n"
             ,0x4e);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)fout,"\t\t}",3);
  if ((undefined1 *)local_100._0_8_ != local_100 + 0x10) {
    operator_delete((void *)local_100._0_8_,CONCAT71(local_100._17_7_,local_100[0x10]) + 1);
  }
  return;
}

Assistant:

void cmExtraSublimeTextGenerator::AppendTarget(
  cmGeneratedFileStream& fout, const std::string& targetName,
  cmLocalGenerator* lg, cmGeneratorTarget* target, const char* make,
  const cmMakefile* makefile, const char* /*compiler*/,
  MapSourceFileFlags& sourceFileFlags, bool firstTarget)
{

  if (target != nullptr) {
    std::vector<cmSourceFile*> sourceFiles;
    target->GetSourceFiles(sourceFiles,
                           makefile->GetSafeDefinition("CMAKE_BUILD_TYPE"));
    for (cmSourceFile* sourceFile : sourceFiles) {
      MapSourceFileFlags::iterator sourceFileFlagsIter =
        sourceFileFlags.find(sourceFile->GetFullPath());
      if (sourceFileFlagsIter == sourceFileFlags.end()) {
        sourceFileFlagsIter =
          sourceFileFlags
            .insert(MapSourceFileFlags::value_type(sourceFile->GetFullPath(),
                                                   std::vector<std::string>()))
            .first;
      }
      std::vector<std::string>& flags = sourceFileFlagsIter->second;
      std::string flagsString =
        this->ComputeFlagsForObject(sourceFile, lg, target);
      std::string definesString = this->ComputeDefines(sourceFile, lg, target);
      std::string includesString =
        this->ComputeIncludes(sourceFile, lg, target);
      flags.clear();
      cmsys::RegularExpression flagRegex;
      // Regular expression to extract compiler flags from a string
      // https://gist.github.com/3944250
      const char* regexString =
        R"((^|[ ])-[DIOUWfgs][^= ]+(=\"[^"]+\"|=[^"][^ ]+)?)";
      flagRegex.compile(regexString);
      std::string workString =
        flagsString + " " + definesString + " " + includesString;
      while (flagRegex.find(workString)) {
        std::string::size_type start = flagRegex.start();
        if (workString[start] == ' ') {
          start++;
        }
        flags.push_back(workString.substr(start, flagRegex.end() - start));
        if (flagRegex.end() < workString.size()) {
          workString = workString.substr(flagRegex.end());
        } else {
          workString.clear();
        }
      }
    }
  }

  // Ninja uses ninja.build files (look for a way to get the output file name
  // from cmMakefile or something)
  std::string makefileName;
  if (this->GlobalGenerator->GetName() == "Ninja") {
    makefileName = "build.ninja";
  } else {
    makefileName = "Makefile";
  }
  if (!firstTarget) {
    fout << ",\n\t";
  }
  fout << "\t{\n\t\t\t\"name\": \"" << lg->GetProjectName() << " - "
       << targetName << "\",\n";
  fout << "\t\t\t\"cmd\": ["
       << this->BuildMakeCommand(make, makefileName.c_str(), targetName)
       << "],\n";
  fout << "\t\t\t\"working_dir\": \"${project_path}\",\n";
  fout << "\t\t\t\"file_regex\": \""
          "^(..[^:]*)(?::|\\\\()([0-9]+)(?::|\\\\))(?:([0-9]+):)?\\\\s*(.*)"
          "\"\n";
  fout << "\t\t}";
}